

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.h
# Opt level: O2

void __thiscall pzgeom::TPZWavyLine::SetData(TPZWavyLine *this,TPZVec<double> *wavedir,int numwaves)

{
  TPZManVector<double,_3> local_50;
  
  TPZManVector<double,_3>::TPZManVector(&local_50,wavedir);
  TPZManVector<double,_3>::operator=(&this->fWaveDir,&local_50);
  TPZManVector<double,_3>::~TPZManVector(&local_50);
  this->fNumWaves = numwaves;
  return;
}

Assistant:

void SetData(TPZVec<REAL> &wavedir, int numwaves)
        {
#ifdef PZDEBUG
            if (wavedir.size() != 3) {
                DebugStop();
            }
#endif
            fWaveDir = wavedir;
            fNumWaves = numwaves;
        }